

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmSwitch(ExpressionContext *ctx,VmModule *module,ExprSwitch *node)

{
  SynBase *pSVar1;
  VmFunction *pVVar2;
  VmBlock *trueLabel;
  bool bVar3;
  VmBlock **ppVVar4;
  VmValue *pVVar5;
  VmBlock *local_2a0;
  VmBlock *local_260;
  VmBlock *local_200;
  ExprBase *local_1c0;
  ExprBase *curr_3;
  VmValue *local_1a8;
  VmValue *condition;
  ExprBase *curr_2;
  VmBlock *pVStack_190;
  uint i;
  VmBlock *exitBlock;
  VmBlock *defaultBlock;
  ExprBase *local_178;
  ExprBase *curr_1;
  ExprBase *local_168;
  ExprBase *curr;
  undefined1 local_150 [8];
  SmallArray<VmBlock_*,_16U> caseBlocks;
  SmallArray<VmBlock_*,_16U> conditionBlocks;
  ExprSwitch *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  CompileVm(ctx,module,node->condition);
  SmallArray<VmBlock_*,_16U>::SmallArray
            ((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator,module->allocator);
  SmallArray<VmBlock_*,_16U>::SmallArray((SmallArray<VmBlock_*,_16U> *)local_150,module->allocator);
  for (local_168 = (node->cases).head; local_168 != (ExprBase *)0x0; local_168 = local_168->next) {
    curr_1 = (ExprBase *)
             anon_unknown.dwarf_c91b1::CreateBlock
                       (module,(node->super_ExprBase).source,"switch_case");
    SmallArray<VmBlock_*,_16U>::push_back
              ((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator,(VmBlock **)&curr_1);
  }
  for (local_178 = (node->blocks).head; local_178 != (ExprBase *)0x0; local_178 = local_178->next) {
    defaultBlock = anon_unknown.dwarf_c91b1::CreateBlock
                             (module,(node->super_ExprBase).source,"case_block");
    SmallArray<VmBlock_*,_16U>::push_back((SmallArray<VmBlock_*,_16U> *)local_150,&defaultBlock);
  }
  exitBlock = anon_unknown.dwarf_c91b1::CreateBlock
                        (module,(node->super_ExprBase).source,"default_block");
  pVStack_190 = anon_unknown.dwarf_c91b1::CreateBlock
                          (module,(node->super_ExprBase).source,"switch_exit");
  pSVar1 = (node->super_ExprBase).source;
  bVar3 = SmallArray<VmBlock_*,_16U>::empty((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator);
  if (bVar3) {
    local_200 = exitBlock;
  }
  else {
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                        ((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator,0);
    local_200 = *ppVVar4;
  }
  anon_unknown.dwarf_c91b1::CreateJump(module,pSVar1,&local_200->super_VmValue);
  curr_2._4_4_ = 0;
  for (condition = (VmValue *)(node->cases).head; condition != (VmValue *)0x0;
      condition = (VmValue *)condition->source) {
    pVVar2 = module->currentFunction;
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                        ((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator,curr_2._4_4_);
    VmFunction::AddBlock(pVVar2,*ppVVar4);
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                        ((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator,curr_2._4_4_);
    module->currentBlock = *ppVVar4;
    pVVar5 = CompileVm(ctx,module,(ExprBase *)condition);
    pSVar1 = (node->super_ExprBase).source;
    local_1a8 = pVVar5;
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                        ((SmallArray<VmBlock_*,_16U> *)local_150,curr_2._4_4_);
    trueLabel = *ppVVar4;
    if (condition->source == (SynBase *)0x0) {
      local_260 = exitBlock;
    }
    else {
      ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                          ((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator,curr_2._4_4_ + 1);
      local_260 = *ppVVar4;
    }
    anon_unknown.dwarf_c91b1::CreateJumpNotZero
              (module,pSVar1,pVVar5,&trueLabel->super_VmValue,&local_260->super_VmValue);
    curr_2._4_4_ = curr_2._4_4_ + 1;
  }
  VmModule::LoopInfo::LoopInfo((LoopInfo *)&curr_3,pVStack_190,(VmBlock *)0x0);
  SmallArray<VmModule::LoopInfo,_32U>::push_back(&module->loopInfo,(LoopInfo *)&curr_3);
  curr_2._4_4_ = 0;
  for (local_1c0 = (node->blocks).head; local_1c0 != (ExprBase *)0x0; local_1c0 = local_1c0->next) {
    pVVar2 = module->currentFunction;
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                        ((SmallArray<VmBlock_*,_16U> *)local_150,curr_2._4_4_);
    VmFunction::AddBlock(pVVar2,*ppVVar4);
    ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                        ((SmallArray<VmBlock_*,_16U> *)local_150,curr_2._4_4_);
    module->currentBlock = *ppVVar4;
    CompileVm(ctx,module,local_1c0);
    pSVar1 = (node->super_ExprBase).source;
    if (local_1c0->next == (ExprBase *)0x0) {
      local_2a0 = exitBlock;
    }
    else {
      ppVVar4 = SmallArray<VmBlock_*,_16U>::operator[]
                          ((SmallArray<VmBlock_*,_16U> *)local_150,curr_2._4_4_ + 1);
      local_2a0 = *ppVVar4;
    }
    anon_unknown.dwarf_c91b1::CreateJump(module,pSVar1,&local_2a0->super_VmValue);
    curr_2._4_4_ = curr_2._4_4_ + 1;
  }
  VmFunction::AddBlock(module->currentFunction,exitBlock);
  module->currentBlock = exitBlock;
  if (node->defaultBlock != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->defaultBlock);
  }
  anon_unknown.dwarf_c91b1::CreateJump
            (module,(node->super_ExprBase).source,&pVStack_190->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,pVStack_190);
  module->currentBlock = pVStack_190;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back(&module->loopInfo);
  pVVar5 = anon_unknown.dwarf_c91b1::CreateVoid(module);
  pVVar5 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar5);
  SmallArray<VmBlock_*,_16U>::~SmallArray((SmallArray<VmBlock_*,_16U> *)local_150);
  SmallArray<VmBlock_*,_16U>::~SmallArray((SmallArray<VmBlock_*,_16U> *)&caseBlocks.allocator);
  return pVVar5;
}

Assistant:

VmValue* CompileVmSwitch(ExpressionContext &ctx, VmModule *module, ExprSwitch *node)
{
	CompileVm(ctx, module, node->condition);

	SmallArray<VmBlock*, 16> conditionBlocks(module->allocator);
	SmallArray<VmBlock*, 16> caseBlocks(module->allocator);

	// Generate blocks for all cases
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next)
		conditionBlocks.push_back(CreateBlock(module, node->source, "switch_case"));

	// Generate blocks for all cases
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next)
		caseBlocks.push_back(CreateBlock(module, node->source, "case_block"));

	VmBlock *defaultBlock = CreateBlock(module, node->source, "default_block");
	VmBlock *exitBlock = CreateBlock(module, node->source, "switch_exit");

	CreateJump(module, node->source, conditionBlocks.empty() ? defaultBlock : conditionBlocks[0]);

	unsigned i;

	// Generate code for all conditions
	i = 0;
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(conditionBlocks[i]);
		module->currentBlock = conditionBlocks[i];

		VmValue *condition = CompileVm(ctx, module, curr);

		CreateJumpNotZero(module, node->source, condition, caseBlocks[i], curr->next ? conditionBlocks[i + 1] : defaultBlock);
	}

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, NULL));

	// Generate code for all cases
	i = 0;
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(caseBlocks[i]);
		module->currentBlock = caseBlocks[i];

		CompileVm(ctx, module, curr);

		CreateJump(module, node->source, curr->next ? caseBlocks[i + 1] : defaultBlock);
	}

	// Create default block
	module->currentFunction->AddBlock(defaultBlock);
	module->currentBlock = defaultBlock;

	if(node->defaultBlock)
		CompileVm(ctx, module, node->defaultBlock);
	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}